

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataPdu.cpp
# Opt level: O0

void __thiscall DIS::MinefieldDataPdu::unmarshal(MinefieldDataPdu *this,DataStream *dataStream)

{
  undefined1 local_60 [8];
  Vector3Float x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  TwoByteChunk x;
  size_t idx;
  DataStream *dataStream_local;
  MinefieldDataPdu *this_local;
  
  MinefieldFamilyPdu::unmarshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_minefieldID,dataStream);
  EntityID::unmarshal(&this->_requestingEntityID,dataStream);
  DataStream::operator>>(dataStream,&this->_minefieldSequenceNumbeer);
  DataStream::operator>>(dataStream,&this->_requestID);
  DataStream::operator>>(dataStream,&this->_pduSequenceNumber);
  DataStream::operator>>(dataStream,&this->_numberOfPdus);
  DataStream::operator>>(dataStream,&this->_numberOfMinesInThisPdu);
  DataStream::operator>>(dataStream,&this->_numberOfSensorTypes);
  DataStream::operator>>(dataStream,&this->_pad2);
  DataStream::operator>>(dataStream,&this->_dataFilter);
  EntityType::unmarshal(&this->_mineType,dataStream);
  std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::clear(&this->_sensorTypes);
  x._otherParameters[0] = '\0';
  x._otherParameters[1] = '\0';
  x._10_6_ = 0;
  for (; (ulong)x._8_8_ < (ulong)this->_numberOfSensorTypes; x._8_8_ = x._8_8_ + 1) {
    TwoByteChunk::TwoByteChunk((TwoByteChunk *)local_30);
    TwoByteChunk::unmarshal((TwoByteChunk *)local_30,dataStream);
    std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::push_back
              (&this->_sensorTypes,(value_type *)local_30);
    TwoByteChunk::~TwoByteChunk((TwoByteChunk *)local_30);
  }
  DataStream::operator>>(dataStream,&this->_pad3);
  std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::clear(&this->_mineLocation);
  x_1._z = 0.0;
  x_1._20_4_ = 0;
  for (; (ulong)x_1._16_8_ < (ulong)this->_numberOfMinesInThisPdu; x_1._16_8_ = x_1._16_8_ + 1) {
    Vector3Float::Vector3Float((Vector3Float *)local_60);
    Vector3Float::unmarshal((Vector3Float *)local_60,dataStream);
    std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::push_back
              (&this->_mineLocation,(value_type *)local_60);
    Vector3Float::~Vector3Float((Vector3Float *)local_60);
  }
  return;
}

Assistant:

void MinefieldDataPdu::unmarshal(DataStream& dataStream)
{
    MinefieldFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _minefieldID.unmarshal(dataStream);
    _requestingEntityID.unmarshal(dataStream);
    dataStream >> _minefieldSequenceNumbeer;
    dataStream >> _requestID;
    dataStream >> _pduSequenceNumber;
    dataStream >> _numberOfPdus;
    dataStream >> _numberOfMinesInThisPdu;
    dataStream >> _numberOfSensorTypes;
    dataStream >> _pad2;
    dataStream >> _dataFilter;
    _mineType.unmarshal(dataStream);

     _sensorTypes.clear();
     for(size_t idx = 0; idx < _numberOfSensorTypes; idx++)
     {
        TwoByteChunk x;
        x.unmarshal(dataStream);
        _sensorTypes.push_back(x);
     }
    dataStream >> _pad3;

     _mineLocation.clear();
     for(size_t idx = 0; idx < _numberOfMinesInThisPdu; idx++)
     {
        Vector3Float x;
        x.unmarshal(dataStream);
        _mineLocation.push_back(x);
     }
}